

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O2

xmlNodePtr xmlSAX2TextNode(xmlParserCtxtPtr ctxt,xmlChar *str,int len)

{
  xmlChar xVar1;
  byte bVar2;
  int iVar3;
  int i;
  xmlNodePtr pxVar4;
  xmlChar *pxVar5;
  long lVar6;
  _xmlAttr **__dest;
  xmlRegisterNodeFunc *pp_Var7;
  size_t __n;
  
  pxVar4 = ctxt->freeElems;
  if (pxVar4 == (xmlNodePtr)0x0) {
    pxVar4 = (xmlNodePtr)(*xmlMalloc)(0x78);
    if (pxVar4 != (xmlNodePtr)0x0) goto LAB_0017e825;
    xmlErrMemory(ctxt,"xmlSAX2Characters");
LAB_0017e950:
    pxVar4 = (xmlNodePtr)0x0;
  }
  else {
    ctxt->freeElems = pxVar4->next;
    ctxt->freeElemsNr = ctxt->freeElemsNr + -1;
LAB_0017e825:
    pxVar4->nsDef = (xmlNs *)0x0;
    pxVar4->psvi = (void *)0x0;
    pxVar4->content = (xmlChar *)0x0;
    pxVar4->properties = (_xmlAttr *)0x0;
    pxVar4->doc = (_xmlDoc *)0x0;
    pxVar4->ns = (xmlNs *)0x0;
    pxVar4->next = (_xmlNode *)0x0;
    pxVar4->prev = (_xmlNode *)0x0;
    pxVar4->last = (_xmlNode *)0x0;
    pxVar4->parent = (_xmlNode *)0x0;
    pxVar4->line = 0;
    pxVar4->extra = 0;
    *(undefined4 *)&pxVar4->field_0x74 = 0;
    pxVar4->name = (xmlChar *)0x0;
    pxVar4->children = (_xmlNode *)0x0;
    pxVar4->_private = (void *)0x0;
    *(undefined8 *)&pxVar4->type = 0;
    if (ctxt->dictNames == 0) goto LAB_0017e910;
    __n = (size_t)len;
    xVar1 = str[__n];
    if (len < 0x10) {
      if ((ctxt->options & 0x10000) == 0) {
        if ((3 < len) ||
           (((xVar1 != '\"' && (xVar1 != '\'')) && ((xVar1 != '<' || (str[__n + 1] == '!'))))))
        goto LAB_0017e896;
LAB_0017e97f:
        __dest = (_xmlAttr **)xmlDictLookup(ctxt->dict,str,len);
        pxVar4->type = XML_TEXT_NODE;
        pxVar4->name = "text";
        if (__dest == (_xmlAttr **)0x0) goto LAB_0017e922;
      }
      else {
        __dest = &pxVar4->properties;
        memcpy(__dest,str,__n);
        *(undefined1 *)((long)&pxVar4->properties + __n) = 0;
        pxVar4->type = XML_TEXT_NODE;
        pxVar4->name = "text";
      }
      pxVar4->content = (xmlChar *)__dest;
    }
    else {
LAB_0017e896:
      bVar2 = *str;
      if (((ulong)bVar2 < 0x21) && ((0x100000600U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
        if (len < 0x3c) {
LAB_0017e904:
          if ((xVar1 == '<') && (str[__n + 1] != '!')) {
            for (lVar6 = 1; lVar6 < (long)__n; lVar6 = lVar6 + 1) {
              if ((0x20 < (ulong)str[lVar6]) ||
                 ((0x100002600U >> ((ulong)str[lVar6] & 0x3f) & 1) == 0)) goto LAB_0017e910;
            }
            goto LAB_0017e97f;
          }
        }
      }
      else if ((len < 0x3c) && (bVar2 == 0xd)) goto LAB_0017e904;
LAB_0017e910:
      pxVar4->type = XML_TEXT_NODE;
      pxVar4->name = "text";
LAB_0017e922:
      pxVar5 = xmlStrndup(str,len);
      pxVar4->content = pxVar5;
      if (pxVar5 == (xmlChar *)0x0) {
        xmlSAX2ErrMemory(ctxt,"xmlSAX2TextNode");
        (*xmlFree)(pxVar4);
        goto LAB_0017e950;
      }
    }
    if ((ctxt->linenumbers != 0) && (ctxt->input != (xmlParserInputPtr)0x0)) {
      iVar3 = ctxt->input->line;
      if ((long)iVar3 < 0xffff) {
        pxVar4->line = (unsigned_short)iVar3;
      }
      else {
        pxVar4->line = 0xffff;
        if ((ctxt->options & 0x400000) != 0) {
          pxVar4->psvi = (void *)(long)iVar3;
        }
      }
    }
    if ((__xmlRegisterCallbacks != 0) &&
       (pp_Var7 = __xmlRegisterNodeDefaultValue(), *pp_Var7 != (xmlRegisterNodeFunc)0x0)) {
      pp_Var7 = __xmlRegisterNodeDefaultValue();
      (**pp_Var7)(pxVar4);
    }
  }
  return pxVar4;
}

Assistant:

static xmlNodePtr
xmlSAX2TextNode(xmlParserCtxtPtr ctxt, const xmlChar *str, int len) {
    xmlNodePtr ret;
    const xmlChar *intern = NULL;

    /*
     * Allocate
     */
    if (ctxt->freeElems != NULL) {
	ret = ctxt->freeElems;
	ctxt->freeElems = ret->next;
	ctxt->freeElemsNr--;
    } else {
	ret = (xmlNodePtr) xmlMalloc(sizeof(xmlNode));
    }
    if (ret == NULL) {
        xmlErrMemory(ctxt, "xmlSAX2Characters");
	return(NULL);
    }
    memset(ret, 0, sizeof(xmlNode));
    /*
     * intern the formatting blanks found between tags, or the
     * very short strings
     */
    if (ctxt->dictNames) {
        xmlChar cur = str[len];

	if ((len < (int) (2 * sizeof(void *))) &&
	    (ctxt->options & XML_PARSE_COMPACT)) {
	    /* store the string in the node overriding properties and nsDef */
	    xmlChar *tmp = (xmlChar *) &(ret->properties);
	    memcpy(tmp, str, len);
	    tmp[len] = 0;
	    intern = tmp;
	} else if ((len <= 3) && ((cur == '"') || (cur == '\'') ||
	    ((cur == '<') && (str[len + 1] != '!')))) {
	    intern = xmlDictLookup(ctxt->dict, str, len);
	} else if (IS_BLANK_CH(*str) && (len < 60) && (cur == '<') &&
	           (str[len + 1] != '!')) {
	    int i;

	    for (i = 1;i < len;i++) {
		if (!IS_BLANK_CH(str[i])) goto skip;
	    }
	    intern = xmlDictLookup(ctxt->dict, str, len);
	}
    }
skip:
    ret->type = XML_TEXT_NODE;

    ret->name = xmlStringText;
    if (intern == NULL) {
	ret->content = xmlStrndup(str, len);
	if (ret->content == NULL) {
	    xmlSAX2ErrMemory(ctxt, "xmlSAX2TextNode");
	    xmlFree(ret);
	    return(NULL);
	}
    } else
	ret->content = (xmlChar *) intern;

    if (ctxt->linenumbers) {
	if (ctxt->input != NULL) {
	    if (ctxt->input->line < 65535)
		ret->line = (short) ctxt->input->line;
	    else {
	        ret->line = 65535;
		if (ctxt->options & XML_PARSE_BIG_LINES)
		    ret->psvi = (void *) (ptrdiff_t) ctxt->input->line;
	    }
	}
    }

    if ((__xmlRegisterCallbacks) && (xmlRegisterNodeDefaultValue))
	xmlRegisterNodeDefaultValue(ret);
    return(ret);
}